

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator%(longlong lhs,SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  longlong in_RSI;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_ffffffffffffffd0
  ;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>
  *in_stack_ffffffffffffffd8;
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff8
  ;
  
  SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff8);
  bVar1 = ModulusSimpleCaseHelper<long_long,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::ModulusSimpleCase(in_RSI,in_stack_fffffffffffffff8,in_RDI);
  if (!bVar1) {
    SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
              ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &stack0xffffffffffffffd0,(longlong *)&stack0xffffffffffffffe8);
    SafeInt::operator_cast_to_long_long
              ((SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               in_stack_ffffffffffffffd0.m_int);
    in_stack_fffffffffffffff8 =
         SafeInt<long_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator%
                   (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0.m_int);
  }
  return (SafeInt<long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffff8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator %( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Value of return depends on sign of lhs
    // This one may not be safe - bounds check in constructor
    // if lhs is negative and rhs is unsigned, this will throw an exception.

    // Fast-track the simple case
    // same size and same sign
    SafeInt< T, E > result;

    if( ModulusSimpleCaseHelper< T, U, E, (sizeof(T) == sizeof(U)) && ((bool)std::numeric_limits< T >::is_signed == (bool)std::numeric_limits< U >::is_signed) >::ModulusSimpleCase( lhs, rhs, result ) )
        return result;

    result = (SafeInt< U, E >(lhs) % (T)rhs);
    return result;
}